

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O0

ptr<snapshot> cornerstone::snapshot::deserialize(buffer *buf)

{
  buffer *buf_00;
  buffer *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<snapshot> pVar1;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  element_type *args_2;
  unsigned_long *args_1;
  unsigned_long *in_stack_ffffffffffffffb8;
  unsigned_long local_38 [2];
  ulong local_28;
  buffer *in_stack_ffffffffffffffe0;
  
  args_2 = in_RDI;
  buf_00 = (buffer *)buffer::get_ulong(in_stack_ffffffffffffffe0);
  this = (buffer *)buffer::get_ulong(in_stack_ffffffffffffffe0);
  local_28 = buffer::get_ulong(this);
  args_1 = local_38;
  cluster_config::deserialize(buf_00);
  cs_new<cornerstone::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<cornerstone::cluster_config>&,unsigned_long&>
            (in_stack_ffffffffffffffb8,args_1,(shared_ptr<cornerstone::cluster_config> *)args_2,
             &in_RDI->last_log_idx_);
  std::shared_ptr<cornerstone::cluster_config>::~shared_ptr
            ((shared_ptr<cornerstone::cluster_config> *)0x1e4cc6);
  pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot>)pVar1.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer& buf)
{
    ulong last_log_idx = buf.get_ulong();
    ulong last_log_term = buf.get_ulong();
    ulong size = buf.get_ulong();
    ptr<cluster_config> conf(cluster_config::deserialize(buf));
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size);
}